

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreRenderTarget.h
# Opt level: O2

void __thiscall
irr::video::
COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
::setTextures(COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
              *this,ITexture **textures,u32 numTextures,ITexture *depthStencil,
             E_CUBE_SURFACE *cubeSurfaces,u32 numCubeSurfaces)

{
  array<irr::video::ITexture_*> *this_00;
  array<irr::video::E_CUBE_SURFACE> *this_01;
  code *pcVar1;
  _func_int *p_Var2;
  E_DRIVER_TYPE EVar3;
  pointer ppIVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  ITexture *pIVar9;
  undefined4 extraout_var;
  ulong uVar11;
  char *this_02;
  u32 i_1;
  double __x;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double __x_00;
  array<irr::video::ITexture_*> prevTextures;
  stringc message;
  dimension2d<unsigned_int> *pdVar10;
  
  this_00 = &(this->super_IRenderTarget).Textures;
  bVar5 = core::array<irr::video::ITexture_*>::equals(this_00,textures,numTextures);
  if ((bVar5) &&
     (bVar5 = core::array<irr::video::E_CUBE_SURFACE>::equals
                        (&(this->super_IRenderTarget).CubeSurfaces,cubeSurfaces,numCubeSurfaces),
     bVar5)) {
    bVar5 = false;
  }
  else {
    core::array<irr::video::ITexture_*>::array(&prevTextures,this_00);
    uVar7 = this->ColorAttachment;
    if (uVar7 < numTextures) {
      core::string<char>::string<char>(&message,"This GPU supports up to ");
      core::string<char>::operator+=(&message,this->ColorAttachment);
      core::string<char>::operator+=(&message," textures per render target.");
      os::Printer::log((Printer *)message.str._M_dataplus._M_p,__x);
      ::std::__cxx11::string::_M_dispose();
      uVar7 = this->ColorAttachment;
    }
    if (uVar7 < numTextures) {
      numTextures = uVar7;
    }
    std::vector<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>::resize
              (&this_00->m_data,(ulong)numTextures);
    EVar3 = (this->super_IRenderTarget).DriverType;
    for (uVar11 = 0;
        ppIVar4 = (this->super_IRenderTarget).Textures.m_data.
                  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar11 < ((ulong)((long)(this->super_IRenderTarget).Textures.m_data.
                                super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar4) >> 3 &
                 0xffffffff); uVar11 = uVar11 + 1) {
      pIVar9 = textures[uVar11];
      if (((pIVar9 == (ITexture *)0x0) || (pIVar9->DriverType != EVar3)) ||
         (*(int *)&pIVar9->field_0x84 == 0)) {
        ppIVar4[uVar11] = (ITexture *)0x0;
      }
      else {
        ppIVar4[uVar11] = pIVar9;
        pIVar9 = (this_00->m_data).
                 super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11];
        pcVar1 = (code *)((long)&(pIVar9->NamedPath).Path.str._M_string_length +
                         (long)pIVar9->_vptr_ITexture[0xfffffffffffffffd]);
        *(int *)pcVar1 = *(int *)pcVar1 + 1;
      }
    }
    for (uVar11 = 0;
        uVar11 < ((ulong)((long)prevTextures.m_data.
                                super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)prevTextures.m_data.
                               super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
        uVar11 = uVar11 + 1) {
      pIVar9 = prevTextures.m_data.
               super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar11];
      if (pIVar9 != (ITexture *)0x0) {
        IReferenceCounted::drop
                  ((IReferenceCounted *)
                   ((long)&pIVar9->_vptr_ITexture + (long)pIVar9->_vptr_ITexture[-3]));
      }
    }
    this->RequestTextureUpdate = true;
    std::_Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>::
    ~_Vector_base((_Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_> *)
                  &prevTextures);
    bVar5 = true;
  }
  this_01 = &(this->super_IRenderTarget).CubeSurfaces;
  bVar6 = core::array<irr::video::E_CUBE_SURFACE>::equals(this_01,cubeSurfaces,numCubeSurfaces);
  __x_00 = extraout_XMM0_Qa;
  if (!bVar6) {
    core::array<irr::video::E_CUBE_SURFACE>::set_data
              (this_01,cubeSurfaces,numCubeSurfaces,false,false);
    this->RequestTextureUpdate = true;
    __x_00 = extraout_XMM0_Qa_00;
  }
  pIVar9 = (this->super_IRenderTarget).DepthStencil;
  if (pIVar9 == depthStencil) {
    if (!bVar5) {
      return;
    }
    goto LAB_0021139d;
  }
  if (pIVar9 != (ITexture *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar9->_vptr_ITexture + (long)pIVar9->_vptr_ITexture[-3]));
    (this->super_IRenderTarget).DepthStencil = (ITexture *)0x0;
    __x_00 = extraout_XMM0_Qa_01;
  }
  if ((depthStencil != (ITexture *)0x0) &&
     (depthStencil->DriverType == (this->super_IRenderTarget).DriverType)) {
    if (depthStencil->Type == ETT_2D) {
      if ((*(int *)&depthStencil->field_0x84 != 0) && (depthStencil->ColorFormat - ECF_D16 < 3)) {
        (this->super_IRenderTarget).DepthStencil = depthStencil;
        p_Var2 = (_func_int *)
                 ((long)&(depthStencil->NamedPath).Path.str._M_string_length +
                 (long)depthStencil->_vptr_ITexture[-3]);
        *(int *)p_Var2 = *(int *)p_Var2 + 1;
        goto LAB_00211399;
      }
      this_02 = "Ignoring depth/stencil texture without depth color format.";
    }
    else {
      this_02 = "This driver doesn\'t support depth/stencil to cubemaps.";
    }
    os::Printer::log((Printer *)this_02,__x_00);
  }
LAB_00211399:
  this->RequestDepthStencilUpdate = true;
LAB_0021139d:
  pIVar9 = getTexture(this);
  if ((pIVar9 == (ITexture *)0x0) &&
     (pIVar9 = (this->super_IRenderTarget).DepthStencil, pIVar9 == (ITexture *)0x0)) {
    iVar8 = (*(this->Driver->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x3b])();
    pdVar10 = (dimension2d<unsigned_int> *)CONCAT44(extraout_var,iVar8);
  }
  else {
    pdVar10 = &pIVar9->Size;
  }
  this->Size = *pdVar10;
  return;
}

Assistant:

void setTextures(ITexture *const *textures, u32 numTextures, ITexture *depthStencil, const E_CUBE_SURFACE *cubeSurfaces, u32 numCubeSurfaces) override
	{
		bool needSizeUpdate = false;

		// Set color attachments.
		if (!Textures.equals(textures, numTextures) || !CubeSurfaces.equals(cubeSurfaces, numCubeSurfaces)) {
			needSizeUpdate = true;

			core::array<ITexture *> prevTextures(Textures);

			if (numTextures > static_cast<u32>(ColorAttachment)) {
				core::stringc message = "This GPU supports up to ";
				message += static_cast<u32>(ColorAttachment);
				message += " textures per render target.";

				os::Printer::log(message.c_str(), ELL_WARNING);
			}

			Textures.set_used(core::min_(numTextures, static_cast<u32>(ColorAttachment)));

			for (u32 i = 0; i < Textures.size(); ++i) {
				TOpenGLTexture *currentTexture = (textures[i] && textures[i]->getDriverType() == DriverType) ? static_cast<TOpenGLTexture *>(textures[i]) : 0;

				GLuint textureID = 0;

				if (currentTexture) {
					textureID = currentTexture->getOpenGLTextureName();
				}

				if (textureID != 0) {
					Textures[i] = textures[i];
					Textures[i]->grab();
				} else {
					Textures[i] = 0;
				}
			}

			for (u32 i = 0; i < prevTextures.size(); ++i) {
				if (prevTextures[i])
					prevTextures[i]->drop();
			}

			RequestTextureUpdate = true;
		}

		if (!CubeSurfaces.equals(cubeSurfaces, numCubeSurfaces)) {
			CubeSurfaces.set_data(cubeSurfaces, numCubeSurfaces);
			RequestTextureUpdate = true;
		}

		// Set depth and stencil attachments.
		if (DepthStencil != depthStencil) {
			if (DepthStencil) {
				DepthStencil->drop();
				DepthStencil = 0;
			}

			needSizeUpdate = true;
			TOpenGLTexture *currentTexture = (depthStencil && depthStencil->getDriverType() == DriverType) ? static_cast<TOpenGLTexture *>(depthStencil) : 0;

			if (currentTexture) {
				if (currentTexture->getType() == ETT_2D) {
					GLuint textureID = currentTexture->getOpenGLTextureName();

					const ECOLOR_FORMAT textureFormat = (textureID != 0) ? depthStencil->getColorFormat() : ECF_UNKNOWN;
					if (IImage::isDepthFormat(textureFormat)) {
						DepthStencil = depthStencil;
						DepthStencil->grab();
					} else {
						os::Printer::log("Ignoring depth/stencil texture without depth color format.", ELL_WARNING);
					}
				} else {
					os::Printer::log("This driver doesn't support depth/stencil to cubemaps.", ELL_WARNING);
				}
			}

			RequestDepthStencilUpdate = true;
		}

		if (needSizeUpdate) {
			// Set size required for a viewport.

			ITexture *firstTexture = getTexture();

			if (firstTexture)
				Size = firstTexture->getSize();
			else {
				if (DepthStencil)
					Size = DepthStencil->getSize();
				else
					Size = Driver->getScreenSize();
			}
		}
	}